

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O0

void __thiscall yyFlexLexer::yypush_buffer_state(yyFlexLexer *this,YY_BUFFER_STATE new_buffer)

{
  yy_buffer_state *local_30;
  yy_buffer_state *local_28;
  YY_BUFFER_STATE new_buffer_local;
  yyFlexLexer *this_local;
  
  if (new_buffer != (YY_BUFFER_STATE)0x0) {
    yyensure_buffer_stack(this);
    if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
      local_28 = (yy_buffer_state *)0x0;
    }
    else {
      local_28 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    if (local_28 != (yy_buffer_state *)0x0) {
      *this->yy_c_buf_p = this->yy_hold_char;
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_pos = this->yy_c_buf_p;
      this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_n_chars = this->yy_n_chars;
    }
    if (this->yy_buffer_stack == (yy_buffer_state **)0x0) {
      local_30 = (yy_buffer_state *)0x0;
    }
    else {
      local_30 = this->yy_buffer_stack[this->yy_buffer_stack_top];
    }
    if (local_30 != (yy_buffer_state *)0x0) {
      this->yy_buffer_stack_top = this->yy_buffer_stack_top + 1;
    }
    this->yy_buffer_stack[this->yy_buffer_stack_top] = new_buffer;
    yy_load_buffer_state(this);
    this->yy_did_buffer_switch_on_eof = 1;
  }
  return;
}

Assistant:

void yyFlexLexer::yypush_buffer_state (YY_BUFFER_STATE new_buffer)
/* %endif */
{
    	if (new_buffer == NULL)
		return;

	yyensure_buffer_stack();

	/* This block is copied from yy_switch_to_buffer. */
	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*(yy_c_buf_p) = (yy_hold_char);
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = (yy_c_buf_p);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = (yy_n_chars);
		}

	/* Only push if top exists. Otherwise, replace top. */
	if (YY_CURRENT_BUFFER)
		(yy_buffer_stack_top)++;
	YY_CURRENT_BUFFER_LVALUE = new_buffer;

	/* copied from yy_switch_to_buffer. */
	yy_load_buffer_state(  );
	(yy_did_buffer_switch_on_eof) = 1;
}